

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O2

void __thiscall
QOpenGLTextureGlyphCache::resizeTextureData(QOpenGLTextureGlyphCache *this,int width,int height)

{
  int iVar1;
  socklen_t sVar2;
  QOpenGLGlyphTexture *pQVar3;
  QOpenGL2PaintEngineExPrivate *pQVar4;
  bool bVar5;
  int iVar6;
  QOpenGLContext *ctx;
  QOpenGLFunctions *this_00;
  QOpenGLShaderProgram *pQVar7;
  char *s;
  char *pcVar8;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr_01;
  char *s_00;
  char *s_01;
  char *s_02;
  socklen_t sVar9;
  long in_FS_OFFSET;
  QLatin1String local_a8;
  QLatin1String local_98;
  QLatin1String local_88;
  QLatin1String local_78;
  GLuint tmp_texture;
  GLuint oldTexture;
  GLint oldFbo;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = (QOpenGLContext *)QOpenGLContext::currentContext();
  if (ctx == (QOpenGLContext *)0x0) {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,
               "QOpenGLTextureGlyphCache::resizeTextureData: Called with no context");
  }
  else {
    this_00 = (QOpenGLFunctions *)QOpenGLContext::functions();
    oldFbo = -0x55555556;
    (**(code **)(*(long *)this_00 + 200))(0x8ca6);
    pQVar3 = this->m_textureResource;
    if (width < 0x11) {
      width = 0x10;
    }
    iVar1 = pQVar3->m_width;
    sVar9 = 0x10;
    if (0x10 < height) {
      sVar9 = height;
    }
    sVar2 = pQVar3->m_height;
    oldTexture = pQVar3->m_texture;
    (**(code **)(*(long *)this + 0x10))(this,width,sVar9);
    if (*(char *)(*(long *)(ctx + 8) + 0xfc) == '\x01') {
      QImageTextureGlyphCache::resizeTextureData((int)this,width);
      if (iVar1 < width) {
        width = iVar1;
      }
      if ((int)sVar2 < (int)sVar9) {
        sVar9 = sVar2;
      }
      load_glyph_image_region_to_texture
                (ctx,(QImage *)&this->field_0xa0,0,0,width,sVar9,this->m_textureResource->m_texture,
                 0,0);
    }
    else {
      QOpenGLFunctions::glBindFramebuffer(this_00,0x8d40,this->m_textureResource->m_fbo);
      tmp_texture = 0xaaaaaaaa;
      (**(code **)(*(long *)this_00 + 0xa8))(1,&tmp_texture);
      (*(code *)**(undefined8 **)this_00)(0xde1,tmp_texture);
      (**(code **)(*(long *)this_00 + 0x140))(0xde1,0,0x1908,iVar1,sVar2,0,0x1908,0x1401,0);
      (**(code **)(*(long *)this_00 + 0x158))(0xde1,0x2801,0x2600);
      (**(code **)(*(long *)this_00 + 0x158))(0xde1,0x2800,0x2600);
      (**(code **)(*(long *)this_00 + 0x158))(0xde1,0x2802,0x812f);
      (**(code **)(*(long *)this_00 + 0x158))(0xde1,0x2803,0x812f);
      this->m_filterMode = Nearest;
      (*(code *)**(undefined8 **)this_00)(0xde1,0);
      (**(code **)(*(long *)this_00 + 0x250))(0x8d40,0x8ce0,0xde1,tmp_texture,0);
      (**(code **)(*(long *)this_00 + 0x178))(0x84c0);
      (*(code *)**(undefined8 **)this_00)(0xde1);
      if (this->pex != (QOpenGL2PaintEngineExPrivate *)0x0) {
        QOpenGL2PaintEngineExPrivate::transferMode(this->pex,BrushDrawingMode);
      }
      (**(code **)(*(long *)this_00 + 0x70))(0xb90);
      (**(code **)(*(long *)this_00 + 0x70))(0xb71);
      (**(code **)(*(long *)this_00 + 0x70))(0xc11);
      (**(code **)(*(long *)this_00 + 0x70))(0xbe2);
      iVar6 = 0;
      sVar9 = sVar2;
      (**(code **)(*(long *)this_00 + 0x170))(0,0,iVar1);
      if (this->pex == (QOpenGL2PaintEngineExPrivate *)0x0) {
        if (this->m_blitProgram == (QOpenGLShaderProgram *)0x0) {
          pQVar7 = (QOpenGLShaderProgram *)operator_new(0x10);
          QOpenGLShaderProgram::QOpenGLShaderProgram(pQVar7,(QObject *)0x0);
          this->m_blitProgram = pQVar7;
          QOpenGLContext::format();
          iVar6 = QSurfaceFormat::profile();
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
          local_58.d._0_4_ = 0;
          local_58.d._4_4_ = 0;
          local_58.ptr._0_4_ = 0;
          local_58.ptr._4_4_ = 0;
          local_58.size._0_4_ = 0;
          local_58.size._4_4_ = 0;
          bVar5 = iVar6 == 1;
          s_01 = 
          "\n    attribute highp   vec2      textureCoordArray; \n    varying   highp   vec2      textureCoords; \n    void setPosition(); \n    void main(void) \n    { \n        setPosition(); \n        textureCoords = textureCoordArray; \n    }\n"
          ;
          if (bVar5) {
            s_01 = 
            "#version 150 core\n    in      vec2      textureCoordArray; \n    out     vec2      textureCoords; \n    void setPosition(); \n    void main(void) \n    { \n        setPosition(); \n        textureCoords = textureCoordArray; \n    }\n"
            ;
          }
          s_00 = 
          "\n    attribute highp   vec4      vertexCoordsArray; \n    void setPosition(void) \n    { \n        gl_Position = vertexCoordsArray; \n    }\n"
          ;
          if (bVar5) {
            s_00 = 
            "\n    in      vec4      vertexCoordsArray; \n    void setPosition(void) \n    { \n        gl_Position = vertexCoordsArray; \n    }\n"
            ;
          }
          s_02 = 
          "\n    lowp vec4 srcPixel(); \n    void main() \n    { \n        gl_FragColor = srcPixel(); \n    }\n"
          ;
          if (bVar5) {
            s_02 = 
            "#version 150 core\n    out     vec4      fragColor; \n    vec4 srcPixel(); \n    void main() \n    { \n        fragColor = srcPixel(); \n    }\n"
            ;
          }
          s = 
          "\n    varying   highp   vec2      textureCoords; \n    uniform           sampler2D imageTexture; \n    lowp vec4 srcPixel() \n    { \nreturn texture2D(imageTexture, textureCoords); \n}\n"
          ;
          if (bVar5) {
            s = 
            "\n    in      vec2      textureCoords; \n    uniform sampler2D imageTexture; \n    vec4 srcPixel() \n    { \n        return texture(imageTexture, textureCoords); \n    }\n"
            ;
          }
          pcVar8 = s;
          QLatin1String::QLatin1String(&local_78,s_01);
          sVar9 = (socklen_t)pcVar8;
          QString::append((QLatin1String *)&local_58);
          QLatin1String::QLatin1String(&local_88,s_00);
          QString::append((QLatin1String *)&local_58);
          QOpenGLShaderProgram::addCacheableShaderFromSourceCode
                    (this->m_blitProgram,(ShaderType)0x1,(QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          local_58.d._0_4_ = 0;
          local_58.d._4_4_ = 0;
          local_58.ptr._0_4_ = 0;
          local_58.ptr._4_4_ = 0;
          local_58.size._0_4_ = 0;
          local_58.size._4_4_ = 0;
          QLatin1String::QLatin1String(&local_98,s_02);
          QString::append((QLatin1String *)&local_58);
          QLatin1String::QLatin1String(&local_a8,s);
          QString::append((QLatin1String *)&local_58);
          QOpenGLShaderProgram::addCacheableShaderFromSourceCode
                    (this->m_blitProgram,(ShaderType)0x2,(QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QOpenGLShaderProgram::bindAttributeLocation(this->m_blitProgram,"vertexCoordsArray",0);
          iVar6 = 0x1783e9;
          QOpenGLShaderProgram::bindAttributeLocation(this->m_blitProgram,"textureCoordArray",1);
          (**(code **)(*(long *)this->m_blitProgram + 0x60))();
          bVar5 = QOpenGLVertexArrayObject::isCreated(&this->m_vao);
          if (bVar5) {
            QOpenGLVertexArrayObject::bind(&this->m_vao,iVar6,__addr,sVar9);
            setupVertexAttribs(this);
          }
        }
        bVar5 = QOpenGLVertexArrayObject::isCreated(&this->m_vao);
        if (bVar5) {
          QOpenGLVertexArrayObject::bind(&this->m_vao,iVar6,__addr_00,sVar9);
          __addr_01 = extraout_RDX;
        }
        else {
          setupVertexAttribs(this);
          __addr_01 = extraout_RDX_00;
        }
        QOpenGLShaderProgram::bind(this->m_blitProgram,iVar6,__addr_01,sVar9);
        pQVar7 = this->m_blitProgram;
      }
      else {
        QOpenGL2PaintEngineExPrivate::uploadData(this->pex,0,this->m_vertexCoordinateArray,8);
        QOpenGL2PaintEngineExPrivate::uploadData(this->pex,1,this->m_textureCoordinateArray,8);
        QOpenGLEngineShaderManager::useBlitProgram
                  ((QOpenGLEngineShaderManager *)this->pex->shaderManager);
        pQVar7 = QOpenGLEngineShaderManager::blitProgram
                           ((QOpenGLEngineShaderManager *)this->pex->shaderManager);
      }
      QOpenGLShaderProgram::setUniformValue(pQVar7,"imageTexture",0);
      (**(code **)(*(long *)this_00 + 0x78))(6,0,4);
      (*(code *)**(undefined8 **)this_00)(0xde1,this->m_textureResource->m_texture);
      (**(code **)(*(long *)this_00 + 0x40))(0xde1,0,0,0,0,0,iVar1,sVar2);
      (**(code **)(*(long *)this_00 + 0x248))(0x8d40,0x8ce0,0x8d41,0);
      (**(code **)(*(long *)this_00 + 0x50))(1,&tmp_texture);
      (**(code **)(*(long *)this_00 + 0x50))(1,&oldTexture);
      QOpenGLFunctions::glBindFramebuffer(this_00,0x8d40,oldFbo);
      pQVar4 = this->pex;
      if (pQVar4 == (QOpenGL2PaintEngineExPrivate *)0x0) {
        bVar5 = QOpenGLVertexArrayObject::isCreated(&this->m_vao);
        if (bVar5) {
          QOpenGLVertexArrayObject::release(&this->m_vao);
        }
        else {
          QOpenGLShaderProgram::disableAttributeArray(this->m_blitProgram,0);
          QOpenGLShaderProgram::disableAttributeArray(this->m_blitProgram,1);
        }
      }
      else {
        (**(code **)(*(long *)this_00 + 0x170))(0,0,pQVar4->width,pQVar4->height);
        QOpenGL2PaintEngineExPrivate::updateClipScissorTest(this->pex);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureGlyphCache::resizeTextureData(int width, int height)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx == nullptr) {
        qWarning("QOpenGLTextureGlyphCache::resizeTextureData: Called with no context");
        return;
    }

    QOpenGLFunctions *funcs = ctx->functions();
    GLint oldFbo;
    funcs->glGetIntegerv(GL_FRAMEBUFFER_BINDING, &oldFbo);

    int oldWidth = m_textureResource->m_width;
    int oldHeight = m_textureResource->m_height;

    // Make the lower glyph texture size 16 x 16.
    if (width < 16)
        width = 16;
    if (height < 16)
        height = 16;

    GLuint oldTexture = m_textureResource->m_texture;
    createTextureData(width, height);

    if (ctx->d_func()->workaround_brokenFBOReadBack) {
        QImageTextureGlyphCache::resizeTextureData(width, height);
        load_glyph_image_region_to_texture(ctx, image(), 0, 0, qMin(oldWidth, width), qMin(oldHeight, height),
                                           m_textureResource->m_texture, 0, 0);
        return;
    }

    // ### the QTextureGlyphCache API needs to be reworked to allow
    // ### resizeTextureData to fail

    funcs->glBindFramebuffer(GL_FRAMEBUFFER, m_textureResource->m_fbo);

    GLuint tmp_texture;
    funcs->glGenTextures(1, &tmp_texture);
    funcs->glBindTexture(GL_TEXTURE_2D, tmp_texture);
    funcs->glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, oldWidth, oldHeight, 0,
                        GL_RGBA, GL_UNSIGNED_BYTE, nullptr);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    m_filterMode = Nearest;
    funcs->glBindTexture(GL_TEXTURE_2D, 0);
    funcs->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
                                  GL_TEXTURE_2D, tmp_texture, 0);

    funcs->glActiveTexture(GL_TEXTURE0 + QT_IMAGE_TEXTURE_UNIT);
    funcs->glBindTexture(GL_TEXTURE_2D, oldTexture);

    if (pex != nullptr)
        pex->transferMode(BrushDrawingMode);

    funcs->glDisable(GL_STENCIL_TEST);
    funcs->glDisable(GL_DEPTH_TEST);
    funcs->glDisable(GL_SCISSOR_TEST);
    funcs->glDisable(GL_BLEND);

    funcs->glViewport(0, 0, oldWidth, oldHeight);

    QOpenGLShaderProgram *blitProgram = nullptr;
    if (pex == nullptr) {
        if (m_blitProgram == nullptr) {
            m_blitProgram = new QOpenGLShaderProgram;
            const bool isCoreProfile = ctx->format().profile() == QSurfaceFormat::CoreProfile;

            {
                QString source;
#ifdef Q_OS_WASM
                source.append(QLatin1StringView(isCoreProfile ? qopenglslUntransformedPositionVertexShader_core : qopenglslUntransformedPositionVertexShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainWithTexCoordsVertexShader_core : qopenglslMainWithTexCoordsVertexShader));
#else
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainWithTexCoordsVertexShader_core : qopenglslMainWithTexCoordsVertexShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslUntransformedPositionVertexShader_core : qopenglslUntransformedPositionVertexShader));
#endif
                m_blitProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Vertex, source);
            }

            {
                QString source;
#ifdef Q_OS_WASM
                source.append(QLatin1StringView(isCoreProfile ? qopenglslImageSrcFragmentShader_core : qopenglslImageSrcFragmentShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainFragmentShader_core : qopenglslMainFragmentShader));
#else
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainFragmentShader_core : qopenglslMainFragmentShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslImageSrcFragmentShader_core : qopenglslImageSrcFragmentShader));
#endif
                m_blitProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Fragment, source);
            }

            m_blitProgram->bindAttributeLocation("vertexCoordsArray", QT_VERTEX_COORDS_ATTR);
            m_blitProgram->bindAttributeLocation("textureCoordArray", QT_TEXTURE_COORDS_ATTR);

            m_blitProgram->link();

            if (m_vao.isCreated()) {
                m_vao.bind();
                setupVertexAttribs();
            }
        }

        if (m_vao.isCreated())
            m_vao.bind();
        else
            setupVertexAttribs();

        m_blitProgram->bind();
        blitProgram = m_blitProgram;

    } else {
        pex->uploadData(QT_VERTEX_COORDS_ATTR, m_vertexCoordinateArray, 8);
        pex->uploadData(QT_TEXTURE_COORDS_ATTR, m_textureCoordinateArray, 8);

        pex->shaderManager->useBlitProgram();
        blitProgram = pex->shaderManager->blitProgram();
    }

    blitProgram->setUniformValue("imageTexture", QT_IMAGE_TEXTURE_UNIT);

    funcs->glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

    funcs->glBindTexture(GL_TEXTURE_2D, m_textureResource->m_texture);

    funcs->glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, oldWidth, oldHeight);

    funcs->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
                                     GL_RENDERBUFFER, 0);
    funcs->glDeleteTextures(1, &tmp_texture);
    funcs->glDeleteTextures(1, &oldTexture);

    funcs->glBindFramebuffer(GL_FRAMEBUFFER, (GLuint)oldFbo);

    if (pex != nullptr) {
        funcs->glViewport(0, 0, pex->width, pex->height);
        pex->updateClipScissorTest();
    } else {
        if (m_vao.isCreated()) {
            m_vao.release();
        } else {
            m_blitProgram->disableAttributeArray(int(QT_VERTEX_COORDS_ATTR));
            m_blitProgram->disableAttributeArray(int(QT_TEXTURE_COORDS_ATTR));
        }
    }
}